

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O0

int LoadEncodedFrame(TFileStream *pStream,PCASC_FILE_FRAME pFrame,LPBYTE pbEncodedFrame,
                    DWORD dwVerifyIntegrity)

{
  bool bVar1;
  DWORD local_34;
  ulong uStack_30;
  int nError;
  ULONGLONG FileOffset;
  LPBYTE pBStack_20;
  DWORD dwVerifyIntegrity_local;
  LPBYTE pbEncodedFrame_local;
  PCASC_FILE_FRAME pFrame_local;
  TFileStream *pStream_local;
  
  uStack_30 = (ulong)pFrame->DataFileOffset;
  local_34 = 0;
  FileOffset._4_4_ = dwVerifyIntegrity;
  pBStack_20 = pbEncodedFrame;
  pbEncodedFrame_local = (LPBYTE)pFrame;
  pFrame_local = (PCASC_FILE_FRAME)pStream;
  bVar1 = FileStream_Read(pStream,&stack0xffffffffffffffd0,pbEncodedFrame,pFrame->EncodedSize);
  if (bVar1) {
    if ((FileOffset._4_4_ != 0) &&
       (bVar1 = VerifyDataBlockHash(pBStack_20,*(DWORD *)(pbEncodedFrame_local + 0x18),
                                    pbEncodedFrame_local), !bVar1)) {
      local_34 = 0x3ec;
    }
  }
  else {
    local_34 = GetLastError();
  }
  return local_34;
}

Assistant:

static int LoadEncodedFrame(TFileStream * pStream, PCASC_FILE_FRAME pFrame, LPBYTE pbEncodedFrame, DWORD dwVerifyIntegrity)
{
    ULONGLONG FileOffset = pFrame->DataFileOffset;
    int nError = ERROR_SUCCESS;

    // Load the encoded frame to memory
    if(FileStream_Read(pStream, &FileOffset, pbEncodedFrame, pFrame->EncodedSize))
    {
        if (dwVerifyIntegrity)
        {
            if (!VerifyDataBlockHash(pbEncodedFrame, pFrame->EncodedSize, pFrame->FrameHash.Value))
                nError = ERROR_FILE_CORRUPT;
        }
    }
    else
    {
        nError = GetLastError();
    }

    return nError;
}